

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void cfd::core::FreeWallyBuffer(void *source)

{
  CfdException *this;
  int ret;
  int local_94;
  undefined1 local_90 [32];
  wally_operations local_70;
  
  local_70.reserved_2 = (void *)0x0;
  local_70.reserved_3 = (void *)0x0;
  local_70.secp_context_fn = (secp_context_t)0x0;
  local_70.reserved_1 = (void *)0x0;
  local_70.bzero_fn = (wally_bzero_t)0x0;
  local_70.ec_nonce_fn = (wally_ec_nonce_t)0x0;
  local_70.malloc_fn = (wally_malloc_t)0x0;
  local_70.free_fn = (wally_free_t)0x0;
  local_70.reserved_4 = (void *)0x0;
  local_70.struct_size = 0x50;
  local_94 = wally_get_operations(&local_70);
  if (local_94 == 0) {
    (*local_70.free_fn)(source);
    return;
  }
  local_90._0_8_ = "cfdcore_psbt.cpp";
  local_90._8_4_ = 0x1b3;
  local_90._16_8_ = "FreeWallyBuffer";
  logger::log<int&>((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"wally_get_operations NG[{}]",
                    &local_94);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_90._0_8_ = local_90 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"OperationFunctions get error.","");
  CfdException::CfdException(this,kCfdInternalError,(string *)local_90);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void FreeWallyBuffer(void *source) {
  wally_free_t free_func = nullptr;

  int ret;
  if (free_func == nullptr) {
    struct wally_operations ops;
    memset(&ops, 0, sizeof(ops));
    ops.struct_size = sizeof(ops);
    ret = wally_get_operations(&ops);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_get_operations NG[{}]", ret);
      throw CfdException(kCfdInternalError, "OperationFunctions get error.");
    }
    free_func = ops.free_fn;
  }
  free_func(source);
}